

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdset.c
# Opt level: O1

void TryRemovePollFd(fdset_s *self,sock fd)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  iVar1 = self->nfds;
  uVar2 = 0xffffffff;
  if (0 < (long)iVar1) {
    lVar3 = 0;
    do {
      if (self->pollFds[lVar3].fd == fd) {
        uVar2 = (uint)lVar3;
        break;
      }
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
  }
  if (uVar2 != 0xffffffff) {
    memmove(self->pollFds + (int)uVar2,self->pollFds + (long)(int)uVar2 + 1,
            (long)(int)(~uVar2 + iVar1) << 3);
    iVar1 = self->nfds;
    self->nfds = iVar1 + -1;
    if (iVar1 < 1) {
      __assert_fail("self->nfds >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/fdset.c"
                    ,0x53,"void TryRemovePollFd(struct fdset_s *, sock)");
    }
  }
  return;
}

Assistant:

static
void TryRemovePollFd(struct fdset_s* self, sock fd)
{
    int pos = -1;
    int i = 0;
    for (; i < self->nfds; i++)
    {
        if(self->pollFds[i].fd == fd)
        {
            pos = i;
            break;
        }
    }

    if (pos != -1)
    {
        memmove(self->pollFds + pos, self->pollFds + pos + 1, sizeof(struct pollfd)*(self->nfds - pos - 1));
        self->nfds--;
        assert(self->nfds >= 0);
    }
}